

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O2

void __thiscall index_tree::build_index(index_tree *this,wstring *word)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  set_current_index(this,1);
  uVar1 = word->_M_string_length;
  if (uVar1 == 1) {
    index::build_index((this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,word);
    return;
  }
  for (uVar2 = 1; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    index::build_index((this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,word);
    uVar1 = word->_M_string_length;
  }
  return;
}

Assistant:

void index_tree::build_index(const std::wstring& word)
{
    // 将当前索引设置为一级索引
    set_current_index(1);

    if (word.size() == 1)
    {
        current_index_->build_index(word);
    }
    else
    {
        for (std::size_t i = 1; i < word.size(); ++i)
        {
            current_index_->build_index(word);
        }
    }
}